

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_opengl3.cpp
# Opt level: O2

void ImGui_ImplOpenGL3_RenderDrawData(ImDrawData *draw_data)

{
  ImVec2 IVar1;
  ImVec2 IVar2;
  undefined8 uVar3;
  ImDrawList *pIVar4;
  ImDrawCmd *pIVar5;
  code *pcVar6;
  undefined1 auVar7 [16];
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  undefined4 in_EAX;
  int iVar14;
  ImGui_ImplOpenGL3_Data *pIVar15;
  long lVar16;
  GL3WglProc *pp_Var17;
  long lVar18;
  long lVar19;
  GL3WglProc *pp_Var20;
  ulong uVar21;
  undefined8 uVar22;
  long lVar23;
  int cmd_i;
  bool bVar24;
  int iVar25;
  float fVar26;
  undefined1 auVar27 [16];
  float fVar28;
  float fVar29;
  int fb_width;
  int fb_height;
  GLuint vertex_array_object;
  GLuint last_sampler;
  GLuint last_program;
  GLenum last_blend_equation_alpha;
  GLenum last_blend_equation_rgb;
  GLenum last_blend_dst_alpha;
  GLenum last_blend_src_alpha;
  GLenum last_blend_dst_rgb;
  GLenum last_blend_src_rgb;
  GLint last_polygon_mode [2];
  GLuint last_vertex_array_object;
  GLuint last_array_buffer;
  GLuint last_texture;
  GLenum last_active_texture;
  undefined8 local_b8;
  int iStack_b0;
  int iStack_ac;
  GLint last_scissor_box [4];
  GLint last_viewport [4];
  float local_58;
  float fStack_54;
  float local_48;
  float fStack_44;
  
  fb_width = (int)((draw_data->FramebufferScale).x * (draw_data->DisplaySize).x);
  fb_height = (int)((draw_data->FramebufferScale).y * (draw_data->DisplaySize).y);
  auVar27._0_4_ = -(uint)(0 < fb_width);
  auVar27._4_4_ = -(uint)(0 < fb_width);
  auVar27._8_4_ = -(uint)(0 < fb_height);
  auVar27._12_4_ = -(uint)(0 < fb_height);
  iVar14 = movmskpd(in_EAX,auVar27);
  if (iVar14 != 3) {
    return;
  }
  pIVar15 = ImGui_ImplOpenGL3_GetBackendData();
  (*imgl3wProcs.ptr[0x22])(0x84e0,&last_active_texture);
  (*imgl3wProcs.ptr[0])(0x84c0);
  (*imgl3wProcs.ptr[0x22])(0x8b8d,&last_program);
  (*imgl3wProcs.ptr[0x22])(0x8069,&last_texture);
  if ((pIVar15->GlVersion < 0x14a) && (pIVar15->GlProfileIsES3 != true)) {
    last_sampler = 0;
  }
  else {
    (*imgl3wProcs.ptr[0x22])(0x8919,&last_sampler);
  }
  (*imgl3wProcs.ptr[0x22])(0x8894,&last_array_buffer);
  (*imgl3wProcs.ptr[0x22])(0x85b5,&last_vertex_array_object);
  if (pIVar15->HasPolygonMode == true) {
    (*imgl3wProcs.ptr[0x22])(0xb40,last_polygon_mode);
  }
  (*imgl3wProcs.ptr[0x22])(0xba2,last_viewport);
  (*imgl3wProcs.ptr[0x22])(0xc10,last_scissor_box);
  (*imgl3wProcs.ptr[0x22])(0x80c9,&last_blend_src_rgb);
  (*imgl3wProcs.ptr[0x22])(0x80c8,&last_blend_dst_rgb);
  (*imgl3wProcs.ptr[0x22])(0x80cb,&last_blend_src_alpha);
  (*imgl3wProcs.ptr[0x22])(0x80ca,&last_blend_dst_alpha);
  (*imgl3wProcs.ptr[0x22])(0x8009,&last_blend_equation_rgb);
  (*imgl3wProcs.ptr[0x22])(0x883d,&last_blend_equation_alpha);
  cVar8 = (*imgl3wProcs.ptr[0x2c])(0xbe2);
  cVar9 = (*imgl3wProcs.ptr[0x2c])(0xb44);
  cVar10 = (*imgl3wProcs.ptr[0x2c])(0xb71);
  cVar11 = (*imgl3wProcs.ptr[0x2c])(0xb90);
  cVar12 = (*imgl3wProcs.ptr[0x2c])(0xc11);
  bVar24 = true;
  if (0x135 < pIVar15->GlVersion) {
    cVar13 = (*imgl3wProcs.ptr[0x2c])(0x8f9d);
    bVar24 = cVar13 == '\0';
  }
  vertex_array_object = 0;
  (*imgl3wProcs.ptr[0x1f])(1,&vertex_array_object);
  iStack_b0 = fb_height;
  iStack_ac = fb_height;
  local_b8._0_4_ = fb_height;
  local_b8._4_4_ = fb_height;
  ImGui_ImplOpenGL3_SetupRenderState(draw_data,fb_width,fb_height,vertex_array_object);
  IVar1 = draw_data->DisplayPos;
  IVar2 = draw_data->FramebufferScale;
  fVar26 = (float)(int)local_b8;
  local_b8 = pIVar15;
  for (lVar18 = 0; pIVar15 = local_b8, lVar18 < draw_data->CmdListsCount; lVar18 = lVar18 + 1) {
    pIVar4 = (draw_data->CmdLists).Data[lVar18];
    lVar16 = (long)(pIVar4->VtxBuffer).Size;
    lVar19 = lVar16 * 0x14;
    lVar23 = (long)(pIVar4->IdxBuffer).Size * 4;
    if (local_b8->UseBufferSubData == true) {
      if (SBORROW8(local_b8->VertexBufferSize,lVar19) !=
          local_b8->VertexBufferSize + lVar16 * -0x14 < 0) {
        local_b8->VertexBufferSize = lVar19;
        (*imgl3wProcs.ptr[9])(0x8892,lVar19,0,0x88e0);
      }
      if (pIVar15->IndexBufferSize < lVar23) {
        pIVar15->IndexBufferSize = lVar23;
        (*imgl3wProcs.ptr[9])(0x8893,lVar23,0,0x88e0);
      }
      (*imgl3wProcs.ptr[10])(0x8892,0,lVar19,(pIVar4->VtxBuffer).Data);
      (*imgl3wProcs.ptr[10])(0x8893,0,lVar23,(pIVar4->IdxBuffer).Data);
    }
    else {
      (*imgl3wProcs.ptr[9])(0x8892,lVar19,(pIVar4->VtxBuffer).Data,0x88e0);
      (*imgl3wProcs.ptr[9])(0x8893,lVar23,(pIVar4->IdxBuffer).Data,0x88e0);
    }
    lVar16 = 0;
    for (lVar19 = 0; lVar19 < (pIVar4->CmdBuffer).Size; lVar19 = lVar19 + 1) {
      pIVar5 = (pIVar4->CmdBuffer).Data;
      pcVar6 = *(code **)((long)&pIVar5->UserCallback + lVar16);
      if (pcVar6 == (code *)0x0) {
        uVar22 = *(undefined8 *)((long)&(pIVar5->ClipRect).x + lVar16);
        uVar3 = *(undefined8 *)((long)&(pIVar5->ClipRect).z + lVar16);
        local_48 = IVar1.x;
        fStack_44 = IVar1.y;
        local_58 = IVar2.x;
        fStack_54 = IVar2.y;
        fVar28 = ((float)uVar22 - local_48) * local_58;
        fVar29 = ((float)((ulong)uVar22 >> 0x20) - fStack_44) * fStack_54;
        local_58 = ((float)uVar3 - local_48) * local_58;
        fStack_54 = ((float)((ulong)uVar3 >> 0x20) - fStack_44) * fStack_54;
        iVar14 = -(uint)(fVar28 < local_58);
        iVar25 = -(uint)(fVar29 < fStack_54);
        auVar7._4_4_ = iVar14;
        auVar7._0_4_ = iVar14;
        auVar7._8_4_ = iVar25;
        auVar7._12_4_ = iVar25;
        iVar14 = movmskpd(0,auVar7);
        if (iVar14 == 3) {
          (*imgl3wProcs.ptr[0x32])
                    ((ulong)(uint)(int)fVar28,(ulong)(uint)(int)(fVar26 - fStack_54),
                     (ulong)(uint)(int)(local_58 - fVar28),(ulong)(uint)(int)(fStack_54 - fVar29));
          (*imgl3wProcs.ptr[4])(0xde1,(ulong)*(uint *)((long)&pIVar5->TextureId + lVar16));
          uVar21 = (ulong)*(uint *)((long)&pIVar5->ElemCount + lVar16);
          lVar23 = (ulong)*(uint *)((long)&pIVar5->IdxOffset + lVar16) << 2;
          if (local_b8->GlVersion < 0x140) {
            (*imgl3wProcs.ptr[0x18])(4,uVar21,0x1405,lVar23);
          }
          else {
            (*imgl3wProcs.ptr[0x19])
                      (4,uVar21,0x1405,lVar23,(ulong)*(uint *)((long)&pIVar5->VtxOffset + lVar16));
          }
        }
      }
      else if (pcVar6 == (code *)0xfffffffffffffff8) {
        ImGui_ImplOpenGL3_SetupRenderState(draw_data,fb_width,fb_height,vertex_array_object);
      }
      else {
        (*pcVar6)(pIVar4);
      }
      lVar16 = lVar16 + 0x38;
    }
  }
  (*imgl3wProcs.ptr[0x14])(1,&vertex_array_object);
  if (last_program == 0) {
    uVar21 = 0;
  }
  else {
    cVar13 = (*imgl3wProcs.ptr[0x2d])();
    if (cVar13 == '\0') goto LAB_001ac9f0;
    uVar21 = (ulong)last_program;
  }
  (*imgl3wProcs.ptr[0x38])(uVar21);
LAB_001ac9f0:
  (*imgl3wProcs.ptr[4])(0xde1,(ulong)last_texture);
  if ((0x149 < pIVar15->GlVersion) || (pIVar15->GlProfileIsES3 == true)) {
    (*imgl3wProcs.ptr[3])(0,(ulong)last_sampler);
  }
  (*imgl3wProcs.ptr[0])((ulong)last_active_texture);
  (*imgl3wProcs.ptr[5])((ulong)last_vertex_array_object);
  (*imgl3wProcs.ptr[2])(0x8892,(ulong)last_array_buffer);
  (*imgl3wProcs.ptr[7])((ulong)last_blend_equation_rgb,(ulong)last_blend_equation_alpha);
  (*imgl3wProcs.ptr[8])
            ((ulong)last_blend_src_rgb,(ulong)last_blend_dst_rgb,(ulong)last_blend_src_alpha,
             (ulong)last_blend_dst_alpha);
  pp_Var20 = imgl3wProcs.ptr + 0x1a;
  pp_Var17 = imgl3wProcs.ptr + 0x1a;
  if (cVar8 == '\0') {
    pp_Var17 = imgl3wProcs.ptr + 0x16;
  }
  (**pp_Var17)(0xbe2);
  pp_Var17 = imgl3wProcs.ptr + 0x1a;
  if (cVar9 == '\0') {
    pp_Var17 = imgl3wProcs.ptr + 0x16;
  }
  (**pp_Var17)(0xb44);
  pp_Var17 = imgl3wProcs.ptr + 0x1a;
  if (cVar10 == '\0') {
    pp_Var17 = imgl3wProcs.ptr + 0x16;
  }
  (**pp_Var17)(0xb71);
  pp_Var17 = imgl3wProcs.ptr + 0x1a;
  if (cVar11 == '\0') {
    pp_Var17 = imgl3wProcs.ptr + 0x16;
  }
  (**pp_Var17)(0xb90);
  pIVar15 = local_b8;
  if (cVar12 == '\0') {
    pp_Var20 = imgl3wProcs.ptr + 0x16;
  }
  (**pp_Var20)(0xc11);
  if (0x135 < pIVar15->GlVersion) {
    (**(code **)((long)&imgl3wProcs + (ulong)(bVar24 ^ 1) * 0x20 + 0xb0))(0x8f9d);
  }
  if (pIVar15->HasPolygonMode == true) {
    if ((pIVar15->GlVersion < 0x137) || (pIVar15->GlProfileIsCompat == true)) {
      (*imgl3wProcs.ptr[0x30])(0x404,(ulong)(uint)last_polygon_mode[0]);
      uVar22 = 0x405;
    }
    else {
      uVar22 = 0x408;
      last_polygon_mode[1] = last_polygon_mode[0];
    }
    (*imgl3wProcs.ptr[0x30])(uVar22,(ulong)(uint)last_polygon_mode[1]);
  }
  (*imgl3wProcs.ptr[0x3a])
            ((ulong)(uint)last_viewport[0],(ulong)(uint)last_viewport[1],
             (ulong)(uint)last_viewport[2],(ulong)(uint)last_viewport[3]);
  (*imgl3wProcs.ptr[0x32])
            ((ulong)(uint)last_scissor_box[0],(ulong)(uint)last_scissor_box[1],
             (ulong)(uint)last_scissor_box[2],(ulong)(uint)last_scissor_box[3]);
  return;
}

Assistant:

void    ImGui_ImplOpenGL3_RenderDrawData(ImDrawData* draw_data)
{
    // Avoid rendering when minimized, scale coordinates for retina displays (screen coordinates != framebuffer coordinates)
    int fb_width = (int)(draw_data->DisplaySize.x * draw_data->FramebufferScale.x);
    int fb_height = (int)(draw_data->DisplaySize.y * draw_data->FramebufferScale.y);
    if (fb_width <= 0 || fb_height <= 0)
        return;

    ImGui_ImplOpenGL3_Data* bd = ImGui_ImplOpenGL3_GetBackendData();

    // Backup GL state
    GLenum last_active_texture; glGetIntegerv(GL_ACTIVE_TEXTURE, (GLint*)&last_active_texture);
    glActiveTexture(GL_TEXTURE0);
    GLuint last_program; glGetIntegerv(GL_CURRENT_PROGRAM, (GLint*)&last_program);
    GLuint last_texture; glGetIntegerv(GL_TEXTURE_BINDING_2D, (GLint*)&last_texture);
#ifdef IMGUI_IMPL_OPENGL_MAY_HAVE_BIND_SAMPLER
    GLuint last_sampler; if (bd->GlVersion >= 330 || bd->GlProfileIsES3) { glGetIntegerv(GL_SAMPLER_BINDING, (GLint*)&last_sampler); } else { last_sampler = 0; }
#endif
    GLuint last_array_buffer; glGetIntegerv(GL_ARRAY_BUFFER_BINDING, (GLint*)&last_array_buffer);
#ifndef IMGUI_IMPL_OPENGL_USE_VERTEX_ARRAY
    // This is part of VAO on OpenGL 3.0+ and OpenGL ES 3.0+.
    GLint last_element_array_buffer; glGetIntegerv(GL_ELEMENT_ARRAY_BUFFER_BINDING, &last_element_array_buffer);
    ImGui_ImplOpenGL3_VtxAttribState last_vtx_attrib_state_pos; last_vtx_attrib_state_pos.GetState(bd->AttribLocationVtxPos);
    ImGui_ImplOpenGL3_VtxAttribState last_vtx_attrib_state_uv; last_vtx_attrib_state_uv.GetState(bd->AttribLocationVtxUV);
    ImGui_ImplOpenGL3_VtxAttribState last_vtx_attrib_state_color; last_vtx_attrib_state_color.GetState(bd->AttribLocationVtxColor);
#endif
#ifdef IMGUI_IMPL_OPENGL_USE_VERTEX_ARRAY
    GLuint last_vertex_array_object; glGetIntegerv(GL_VERTEX_ARRAY_BINDING, (GLint*)&last_vertex_array_object);
#endif
#ifdef IMGUI_IMPL_OPENGL_MAY_HAVE_POLYGON_MODE
    GLint last_polygon_mode[2]; if (bd->HasPolygonMode) { glGetIntegerv(GL_POLYGON_MODE, last_polygon_mode); }
#endif
    GLint last_viewport[4]; glGetIntegerv(GL_VIEWPORT, last_viewport);
    GLint last_scissor_box[4]; glGetIntegerv(GL_SCISSOR_BOX, last_scissor_box);
    GLenum last_blend_src_rgb; glGetIntegerv(GL_BLEND_SRC_RGB, (GLint*)&last_blend_src_rgb);
    GLenum last_blend_dst_rgb; glGetIntegerv(GL_BLEND_DST_RGB, (GLint*)&last_blend_dst_rgb);
    GLenum last_blend_src_alpha; glGetIntegerv(GL_BLEND_SRC_ALPHA, (GLint*)&last_blend_src_alpha);
    GLenum last_blend_dst_alpha; glGetIntegerv(GL_BLEND_DST_ALPHA, (GLint*)&last_blend_dst_alpha);
    GLenum last_blend_equation_rgb; glGetIntegerv(GL_BLEND_EQUATION_RGB, (GLint*)&last_blend_equation_rgb);
    GLenum last_blend_equation_alpha; glGetIntegerv(GL_BLEND_EQUATION_ALPHA, (GLint*)&last_blend_equation_alpha);
    GLboolean last_enable_blend = glIsEnabled(GL_BLEND);
    GLboolean last_enable_cull_face = glIsEnabled(GL_CULL_FACE);
    GLboolean last_enable_depth_test = glIsEnabled(GL_DEPTH_TEST);
    GLboolean last_enable_stencil_test = glIsEnabled(GL_STENCIL_TEST);
    GLboolean last_enable_scissor_test = glIsEnabled(GL_SCISSOR_TEST);
#ifdef IMGUI_IMPL_OPENGL_MAY_HAVE_PRIMITIVE_RESTART
    GLboolean last_enable_primitive_restart = (bd->GlVersion >= 310) ? glIsEnabled(GL_PRIMITIVE_RESTART) : GL_FALSE;
#endif

    // Setup desired GL state
    // Recreate the VAO every time (this is to easily allow multiple GL contexts to be rendered to. VAO are not shared among GL contexts)
    // The renderer would actually work without any VAO bound, but then our VertexAttrib calls would overwrite the default one currently bound.
    GLuint vertex_array_object = 0;
#ifdef IMGUI_IMPL_OPENGL_USE_VERTEX_ARRAY
    GL_CALL(glGenVertexArrays(1, &vertex_array_object));
#endif
    ImGui_ImplOpenGL3_SetupRenderState(draw_data, fb_width, fb_height, vertex_array_object);

    // Will project scissor/clipping rectangles into framebuffer space
    ImVec2 clip_off = draw_data->DisplayPos;         // (0,0) unless using multi-viewports
    ImVec2 clip_scale = draw_data->FramebufferScale; // (1,1) unless using retina display which are often (2,2)

    // Render command lists
    for (int n = 0; n < draw_data->CmdListsCount; n++)
    {
        const ImDrawList* cmd_list = draw_data->CmdLists[n];

        // Upload vertex/index buffers
        // - OpenGL drivers are in a very sorry state nowadays....
        //   During 2021 we attempted to switch from glBufferData() to orphaning+glBufferSubData() following reports
        //   of leaks on Intel GPU when using multi-viewports on Windows.
        // - After this we kept hearing of various display corruptions issues. We started disabling on non-Intel GPU, but issues still got reported on Intel.
        // - We are now back to using exclusively glBufferData(). So bd->UseBufferSubData IS ALWAYS FALSE in this code.
        //   We are keeping the old code path for a while in case people finding new issues may want to test the bd->UseBufferSubData path.
        // - See https://github.com/ocornut/imgui/issues/4468 and please report any corruption issues.
        const GLsizeiptr vtx_buffer_size = (GLsizeiptr)cmd_list->VtxBuffer.Size * (int)sizeof(ImDrawVert);
        const GLsizeiptr idx_buffer_size = (GLsizeiptr)cmd_list->IdxBuffer.Size * (int)sizeof(ImDrawIdx);
        if (bd->UseBufferSubData)
        {
            if (bd->VertexBufferSize < vtx_buffer_size)
            {
                bd->VertexBufferSize = vtx_buffer_size;
                GL_CALL(glBufferData(GL_ARRAY_BUFFER, bd->VertexBufferSize, nullptr, GL_STREAM_DRAW));
            }
            if (bd->IndexBufferSize < idx_buffer_size)
            {
                bd->IndexBufferSize = idx_buffer_size;
                GL_CALL(glBufferData(GL_ELEMENT_ARRAY_BUFFER, bd->IndexBufferSize, nullptr, GL_STREAM_DRAW));
            }
            GL_CALL(glBufferSubData(GL_ARRAY_BUFFER, 0, vtx_buffer_size, (const GLvoid*)cmd_list->VtxBuffer.Data));
            GL_CALL(glBufferSubData(GL_ELEMENT_ARRAY_BUFFER, 0, idx_buffer_size, (const GLvoid*)cmd_list->IdxBuffer.Data));
        }
        else
        {
            GL_CALL(glBufferData(GL_ARRAY_BUFFER, vtx_buffer_size, (const GLvoid*)cmd_list->VtxBuffer.Data, GL_STREAM_DRAW));
            GL_CALL(glBufferData(GL_ELEMENT_ARRAY_BUFFER, idx_buffer_size, (const GLvoid*)cmd_list->IdxBuffer.Data, GL_STREAM_DRAW));
        }

        for (int cmd_i = 0; cmd_i < cmd_list->CmdBuffer.Size; cmd_i++)
        {
            const ImDrawCmd* pcmd = &cmd_list->CmdBuffer[cmd_i];
            if (pcmd->UserCallback != nullptr)
            {
                // User callback, registered via ImDrawList::AddCallback()
                // (ImDrawCallback_ResetRenderState is a special callback value used by the user to request the renderer to reset render state.)
                if (pcmd->UserCallback == ImDrawCallback_ResetRenderState)
                    ImGui_ImplOpenGL3_SetupRenderState(draw_data, fb_width, fb_height, vertex_array_object);
                else
                    pcmd->UserCallback(cmd_list, pcmd);
            }
            else
            {
                // Project scissor/clipping rectangles into framebuffer space
                ImVec2 clip_min((pcmd->ClipRect.x - clip_off.x) * clip_scale.x, (pcmd->ClipRect.y - clip_off.y) * clip_scale.y);
                ImVec2 clip_max((pcmd->ClipRect.z - clip_off.x) * clip_scale.x, (pcmd->ClipRect.w - clip_off.y) * clip_scale.y);
                if (clip_max.x <= clip_min.x || clip_max.y <= clip_min.y)
                    continue;

                // Apply scissor/clipping rectangle (Y is inverted in OpenGL)
                GL_CALL(glScissor((int)clip_min.x, (int)((float)fb_height - clip_max.y), (int)(clip_max.x - clip_min.x), (int)(clip_max.y - clip_min.y)));

                // Bind texture, Draw
                GL_CALL(glBindTexture(GL_TEXTURE_2D, (GLuint)(intptr_t)pcmd->GetTexID()));
#ifdef IMGUI_IMPL_OPENGL_MAY_HAVE_VTX_OFFSET
                if (bd->GlVersion >= 320)
                    GL_CALL(glDrawElementsBaseVertex(GL_TRIANGLES, (GLsizei)pcmd->ElemCount, sizeof(ImDrawIdx) == 2 ? GL_UNSIGNED_SHORT : GL_UNSIGNED_INT, (void*)(intptr_t)(pcmd->IdxOffset * sizeof(ImDrawIdx)), (GLint)pcmd->VtxOffset));
                else
#endif
                GL_CALL(glDrawElements(GL_TRIANGLES, (GLsizei)pcmd->ElemCount, sizeof(ImDrawIdx) == 2 ? GL_UNSIGNED_SHORT : GL_UNSIGNED_INT, (void*)(intptr_t)(pcmd->IdxOffset * sizeof(ImDrawIdx))));
            }
        }
    }

    // Destroy the temporary VAO
#ifdef IMGUI_IMPL_OPENGL_USE_VERTEX_ARRAY
    GL_CALL(glDeleteVertexArrays(1, &vertex_array_object));
#endif

    // Restore modified GL state
    // This "glIsProgram()" check is required because if the program is "pending deletion" at the time of binding backup, it will have been deleted by now and will cause an OpenGL error. See #6220.
    if (last_program == 0 || glIsProgram(last_program)) glUseProgram(last_program);
    glBindTexture(GL_TEXTURE_2D, last_texture);
#ifdef IMGUI_IMPL_OPENGL_MAY_HAVE_BIND_SAMPLER
    if (bd->GlVersion >= 330 || bd->GlProfileIsES3)
        glBindSampler(0, last_sampler);
#endif
    glActiveTexture(last_active_texture);
#ifdef IMGUI_IMPL_OPENGL_USE_VERTEX_ARRAY
    glBindVertexArray(last_vertex_array_object);
#endif
    glBindBuffer(GL_ARRAY_BUFFER, last_array_buffer);
#ifndef IMGUI_IMPL_OPENGL_USE_VERTEX_ARRAY
    glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, last_element_array_buffer);
    last_vtx_attrib_state_pos.SetState(bd->AttribLocationVtxPos);
    last_vtx_attrib_state_uv.SetState(bd->AttribLocationVtxUV);
    last_vtx_attrib_state_color.SetState(bd->AttribLocationVtxColor);
#endif
    glBlendEquationSeparate(last_blend_equation_rgb, last_blend_equation_alpha);
    glBlendFuncSeparate(last_blend_src_rgb, last_blend_dst_rgb, last_blend_src_alpha, last_blend_dst_alpha);
    if (last_enable_blend) glEnable(GL_BLEND); else glDisable(GL_BLEND);
    if (last_enable_cull_face) glEnable(GL_CULL_FACE); else glDisable(GL_CULL_FACE);
    if (last_enable_depth_test) glEnable(GL_DEPTH_TEST); else glDisable(GL_DEPTH_TEST);
    if (last_enable_stencil_test) glEnable(GL_STENCIL_TEST); else glDisable(GL_STENCIL_TEST);
    if (last_enable_scissor_test) glEnable(GL_SCISSOR_TEST); else glDisable(GL_SCISSOR_TEST);
#ifdef IMGUI_IMPL_OPENGL_MAY_HAVE_PRIMITIVE_RESTART
    if (bd->GlVersion >= 310) { if (last_enable_primitive_restart) glEnable(GL_PRIMITIVE_RESTART); else glDisable(GL_PRIMITIVE_RESTART); }
#endif

#ifdef IMGUI_IMPL_OPENGL_MAY_HAVE_POLYGON_MODE
    // Desktop OpenGL 3.0 and OpenGL 3.1 had separate polygon draw modes for front-facing and back-facing faces of polygons
    if (bd->HasPolygonMode) { if (bd->GlVersion <= 310 || bd->GlProfileIsCompat) { glPolygonMode(GL_FRONT, (GLenum)last_polygon_mode[0]); glPolygonMode(GL_BACK, (GLenum)last_polygon_mode[1]); } else { glPolygonMode(GL_FRONT_AND_BACK, (GLenum)last_polygon_mode[0]); } }
#endif // IMGUI_IMPL_OPENGL_MAY_HAVE_POLYGON_MODE

    glViewport(last_viewport[0], last_viewport[1], (GLsizei)last_viewport[2], (GLsizei)last_viewport[3]);
    glScissor(last_scissor_box[0], last_scissor_box[1], (GLsizei)last_scissor_box[2], (GLsizei)last_scissor_box[3]);
    (void)bd; // Not all compilation paths use this
}